

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

pair<unsigned_long,_bool>
detail::try_get_range_size<std::vector<person,std::allocator<person>>>(span<const_std::byte> buffer)

{
  span<const_std::byte> buffer_00;
  size_t sVar1;
  undefined8 extraout_RDX;
  unsigned_long uVar3;
  byte *in_RDI;
  undefined8 uVar4;
  bool bVar5;
  pair<unsigned_long,_bool> pVar6;
  byte *in_stack_ffffffffffffffc8;
  span<const_std::byte> local_30;
  undefined8 uVar2;
  
  local_30.begin_ = in_RDI;
  sVar1 = span<const_std::byte>::size(&local_30);
  if (sVar1 < 8) {
LAB_0010553b:
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = *(undefined8 *)local_30.begin_;
    local_30.begin_ = local_30.begin_ + 8;
    uVar2 = extraout_RDX;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      span<const_std::byte>::size(&local_30);
      buffer_00.end_ = in_stack_ffffffffffffffc8;
      buffer_00.begin_ = (byte *)0x10556d;
      pVar6 = try_get_deserialized_size<person>(buffer_00);
      uVar2 = pVar6._8_8_;
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_0010553b;
      local_30.begin_ = local_30.begin_ + pVar6.first;
    }
    uVar3 = (long)local_30.begin_ - (long)in_RDI;
    uVar4 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
  }
  pVar6._8_8_ = uVar4;
  pVar6.first = uVar3;
  return pVar6;
}

Assistant:

std::pair<size_t, bool> try_get_range_size(span<std::byte const> buffer) noexcept {
        auto const data_begin = buffer.begin();

        size_t count;
        if (buffer.size() < sizeof(count)) return { {}, false };
        deserialize(count, buffer);
        
        using value_type = typename range_traits<T>::value_type;
        if constexpr (serialization_category_v<value_type> == serialization_category::trivial) {
            auto const elements_size = count * sizeof(value_type);
            if (buffer.size() < elements_size) return { {}, false };
            buffer.begin() += elements_size;
        }
        else {
            for (size_t i = 0; i < count; ++i) {
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return { {}, false };
                buffer.begin() += size;
            }
        }
        return { buffer.begin() - data_begin, true };
    }